

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::MatchTrimEnds(ON_Brep *this,ON_BrepLoop *Loop)

{
  int iVar1;
  int *piVar2;
  ON_BrepTrim *pOVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = (Loop->m_ti).m_count;
  lVar8 = (long)iVar1;
  if (lVar8 < 1) {
    ON_BoundingBox::Destroy(&Loop->m_pbox);
    bVar6 = true;
  }
  else {
    bVar6 = true;
    lVar7 = 1;
    do {
      piVar2 = (Loop->m_ti).m_a;
      pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      lVar5 = lVar7;
      if (lVar7 == lVar8) {
        lVar5 = 0;
      }
      bVar4 = MatchTrimEnds(this,pOVar3 + piVar2[lVar7 + -1],pOVar3 + piVar2[lVar5]);
      bVar6 = (bool)(bVar6 & bVar4);
      bVar4 = lVar7 != lVar8;
      lVar7 = lVar7 + 1;
    } while (bVar4);
    ON_BoundingBox::Destroy(&Loop->m_pbox);
    if (0 < iVar1) {
      lVar7 = 0;
      do {
        iVar1 = (Loop->m_ti).m_a[lVar7];
        pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        pOVar3[iVar1].m_pbox.m_min.z = 0.0;
        pOVar3[iVar1].m_pbox.m_max.z = 0.0;
        ON_BoundingBox::Union(&Loop->m_pbox,&pOVar3[iVar1].m_pbox);
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
    }
  }
  return bVar6;
}

Assistant:

bool ON_Brep::MatchTrimEnds(ON_BrepLoop& Loop)

{
  int i;
  bool rc = true;
  int count = Loop.m_ti.Count();
  for (i=0; i<count; i++){
    if (!MatchTrimEnds(m_T[Loop.m_ti[i]], m_T[Loop.m_ti[(i+1)%count]]))
    {
      rc = false;
    }
  }

  // 11 Nov 2002 Dale Lear: I added this pbox setting stuff
  Loop.m_pbox.Destroy();
  for (i=0; i<count; i++)
  {
    ON_BrepTrim& trim = m_T[Loop.m_ti[i]];
    trim.m_pbox.m_min.z = 0.0;
    trim.m_pbox.m_max.z = 0.0;
    Loop.m_pbox.Union( trim.m_pbox );
  }

  return rc;
}